

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<unsigned_int,unsigned_int,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  bool bVar2;
  idx_t iVar3;
  ValidityMask *result_mask;
  ValidityMask *result_data_00;
  SelectionVector *pSVar4;
  uint *puVar5;
  ValidityMask *pVVar6;
  UnifiedVectorFormat *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  byte in_R8B;
  char in_R9B;
  uint uVar7;
  uint *ldata_3;
  uint *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  uint *ldata_2;
  uint *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  uint *ldata_1;
  uint *result_data_1;
  uint *ldata;
  uint *result_data;
  Vector *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  ValidityMask *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffea0;
  undefined1 uVar8;
  void *in_stack_fffffffffffffea8;
  UnifiedVectorFormat *this;
  ValidityMask *in_stack_fffffffffffffeb0;
  ValidityMask *in_stack_fffffffffffffeb8;
  void *in_stack_fffffffffffffec0;
  uint *in_stack_fffffffffffffec8;
  uint *in_stack_fffffffffffffed0;
  Vector *pVVar9;
  ValidityMask *local_b8 [2];
  SelectionVector local_a8 [2];
  SelectionVector *local_70;
  ValidityMask *local_68;
  ValidityMask *local_60;
  Vector *local_58;
  optional_idx local_50;
  uint *local_48;
  uint *local_40;
  uint *local_38;
  uint *local_30;
  char local_22;
  byte local_21;
  UnifiedVectorFormat *local_18;
  Vector *local_10;
  Vector *local_8;
  
  uVar8 = (undefined1)((ulong)in_stack_fffffffffffffea0 >> 0x38);
  uVar7 = (uint)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_21 = in_R8B & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_40 = FlatVector::GetData<unsigned_int>((Vector *)0xe692ff);
    local_48 = FlatVector::GetData<unsigned_int>((Vector *)0xe69314);
    FlatVector::Validity((Vector *)0xe69356);
    FlatVector::Validity((Vector *)0xe6936b);
    ExecuteFlat<unsigned_int,unsigned_int,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(idx_t)in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (bool)uVar8);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_30 = ConstantVector::GetData<unsigned_int>((Vector *)0xe69246);
    local_38 = ConstantVector::GetData<unsigned_int>((Vector *)0xe6925b);
    bVar2 = ConstantVector::IsNull((Vector *)0xe69270);
    if (bVar2) {
      duckdb::ConstantVector::SetNull(local_10,true);
    }
    else {
      duckdb::ConstantVector::SetNull(local_10,false);
      ConstantVector::Validity(local_10);
      uVar7 = UnaryOperatorWrapper::Operation<duckdb::BitwiseNotOperator,unsigned_int,unsigned_int>
                        (uVar7,in_stack_fffffffffffffe78,
                         CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                         in_stack_fffffffffffffe68);
      *local_30 = uVar7;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_50 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe68);
      bVar2 = optional_idx::IsValid(&local_50);
      if ((bVar2) &&
         (iVar3 = optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffeb0),
         (UnifiedVectorFormat *)(iVar3 * 2) < local_18 || (long)(iVar3 * 2) - (long)local_18 == 0))
      {
        local_58 = DictionaryVector::Child((Vector *)0xe69410);
        VVar1 = Vector::GetVectorType(local_58);
        if (VVar1 == FLAT_VECTOR) {
          local_60 = (ValidityMask *)FlatVector::GetData<unsigned_int>((Vector *)0xe6943a);
          result_mask = (ValidityMask *)FlatVector::GetData<unsigned_int>((Vector *)0xe6944f);
          pVVar6 = local_60;
          local_68 = result_mask;
          iVar3 = optional_idx::GetIndex((optional_idx *)result_mask);
          result_data_00 = FlatVector::Validity((Vector *)0xe69490);
          FlatVector::Validity((Vector *)0xe694a2);
          ExecuteFlat<unsigned_int,unsigned_int,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
                    (in_stack_fffffffffffffed0,(uint *)result_data_00,iVar3,pVVar6,result_mask,
                     in_stack_fffffffffffffea8,(bool)uVar8);
          local_70 = DictionaryVector::SelVector((Vector *)0xe694e2);
          pVVar9 = local_10;
          pSVar4 = (SelectionVector *)optional_idx::GetIndex((optional_idx *)result_mask);
          duckdb::Vector::Dictionary(pVVar9,(ulong)local_10,pSVar4,(ulong)local_70);
          return;
        }
      }
    }
    this = (UnifiedVectorFormat *)local_b8;
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this);
    duckdb::Vector::ToUnifiedFormat((ulong)local_8,local_18);
    duckdb::Vector::SetVectorType((VectorType)local_10);
    puVar5 = FlatVector::GetData<unsigned_int>((Vector *)0xe6958a);
    uVar8 = (undefined1)((ulong)puVar5 >> 0x38);
    UnifiedVectorFormat::GetData<unsigned_int>((UnifiedVectorFormat *)local_b8);
    pSVar4 = local_a8;
    pVVar6 = FlatVector::Validity((Vector *)0xe695f5);
    uVar7 = local_21 & 1;
    ExecuteLoop<unsigned_int,unsigned_int,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
              ((uint *)in_stack_fffffffffffffeb0,(uint *)this,(idx_t)pVVar6,pSVar4,local_b8[0],
               (ValidityMask *)local_18,in_stack_fffffffffffffec0,(bool)uVar8);
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe74,uVar7));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}